

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O0

int Gia_ManChoiceMinLevel_rec(Gia_Man_t *p,int iPivot,int fDiveIn,Vec_Int_t *vMap)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pObj;
  int local_50;
  int LevCur;
  int LevMin;
  int iRepr;
  int ObjMin;
  int iObj;
  Gia_Obj_t *pPivot;
  int LevelMax;
  int Level1;
  int Level0;
  Vec_Int_t *vMap_local;
  int fDiveIn_local;
  int iPivot_local;
  Gia_Man_t *p_local;
  
  pObj = Gia_ManObj(p,iPivot);
  iVar1 = Gia_ObjIsCi(pObj);
  if (iVar1 == 0) {
    iVar1 = Gia_ObjLevel(p,pObj);
    if (iVar1 == 0) {
      if ((fDiveIn == 0) || (iVar1 = Gia_ObjIsClass(p,iPivot), iVar1 == 0)) {
        iVar1 = Gia_ObjIsAnd(pObj);
        if (iVar1 == 0) {
          __assert_fail("Gia_ObjIsAnd(pPivot)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                        ,0x226,"int Gia_ManChoiceMinLevel_rec(Gia_Man_t *, int, int, Vec_Int_t *)");
        }
        iVar1 = Gia_ObjFaninId0(pObj,iPivot);
        iVar1 = Gia_ManChoiceMinLevel_rec(p,iVar1,1,vMap);
        iVar2 = Gia_ObjFaninId1(pObj,iPivot);
        iVar2 = Gia_ManChoiceMinLevel_rec(p,iVar2,1,vMap);
        iVar1 = Abc_MaxInt(iVar1,iVar2);
        p_local._4_4_ = iVar1 + 1;
        Gia_ObjSetLevel(p,pObj,p_local._4_4_);
      }
      else {
        LevMin = -1;
        iVar1 = Gia_ObjRepr(p,iPivot);
        local_50 = 1000000000;
        iVar2 = Gia_ObjIsHead(p,iVar1);
        iRepr = iVar1;
        if (iVar2 == 0) {
          __assert_fail("Gia_ObjIsHead(p, iRepr)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                        ,0x217,"int Gia_ManChoiceMinLevel_rec(Gia_Man_t *, int, int, Vec_Int_t *)");
        }
        for (; 0 < iRepr; iRepr = Gia_ObjNext(p,iRepr)) {
          iVar2 = Gia_ManChoiceMinLevel_rec(p,iRepr,0,vMap);
          if (iVar2 < local_50) {
            LevMin = iRepr;
            local_50 = iVar2;
          }
        }
        if (local_50 < 1) {
          __assert_fail("LevMin > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                        ,0x220,"int Gia_ManChoiceMinLevel_rec(Gia_Man_t *, int, int, Vec_Int_t *)");
        }
        Vec_IntWriteEntry(vMap,iVar1,LevMin);
        iVar2 = Gia_ObjIsHead(p,iVar1);
        iRepr = iVar1;
        if (iVar2 == 0) {
          __assert_fail("Gia_ObjIsHead(p, iRepr)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                        ,0x222,"int Gia_ManChoiceMinLevel_rec(Gia_Man_t *, int, int, Vec_Int_t *)");
        }
        for (; 0 < iRepr; iRepr = Gia_ObjNext(p,iRepr)) {
          Gia_ObjSetLevelId(p,iRepr,local_50);
        }
        p_local._4_4_ = local_50;
      }
    }
    else {
      p_local._4_4_ = Gia_ObjLevel(p,pObj);
    }
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Gia_ManChoiceMinLevel_rec( Gia_Man_t * p, int iPivot, int fDiveIn, Vec_Int_t * vMap )
{
    int Level0, Level1, LevelMax;
    Gia_Obj_t * pPivot = Gia_ManObj( p, iPivot );
    if ( Gia_ObjIsCi(pPivot) )
        return 0;
    if ( Gia_ObjLevel(p, pPivot) )
        return Gia_ObjLevel(p, pPivot);
    if ( fDiveIn && Gia_ObjIsClass(p, iPivot) )
    {
        int iObj, ObjMin = -1, iRepr = Gia_ObjRepr(p, iPivot), LevMin = ABC_INFINITY;
        Gia_ClassForEachObj( p, iRepr, iObj )
        {
            int LevCur = Gia_ManChoiceMinLevel_rec( p, iObj, 0, vMap );
            if ( LevMin > LevCur )
            {
                LevMin = LevCur;
                ObjMin = iObj;
            }
        }
        assert( LevMin > 0 );
        Vec_IntWriteEntry( vMap, iRepr, ObjMin );
        Gia_ClassForEachObj( p, iRepr, iObj )
            Gia_ObjSetLevelId( p, iObj, LevMin );
        return LevMin;
    }
    assert( Gia_ObjIsAnd(pPivot) );
    Level0 = Gia_ManChoiceMinLevel_rec( p, Gia_ObjFaninId0(pPivot, iPivot), 1, vMap );
    Level1 = Gia_ManChoiceMinLevel_rec( p, Gia_ObjFaninId1(pPivot, iPivot), 1, vMap );
    LevelMax = 1 + Abc_MaxInt(Level0, Level1);
    Gia_ObjSetLevel( p, pPivot, LevelMax );
    return LevelMax;
}